

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamReader.h
# Opt level: O0

void __thiscall Assimp::StreamReader<true,_true>::InternBegin(StreamReader<true,_true> *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  DeadlyImportError *pDVar4;
  element_type *peVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int8_t *piVar6;
  undefined4 extraout_var_01;
  size_t read;
  string local_70;
  ulong local_50;
  size_t s;
  allocator local_31;
  string local_30;
  StreamReader<true,_true> *local_10;
  StreamReader<true,_true> *this_local;
  
  local_10 = this;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
  if (!bVar1) {
    s._3_1_ = 1;
    pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_30,"StreamReader: Unable to open file",&local_31);
    DeadlyImportError::DeadlyImportError(pDVar4,&local_30);
    s._3_1_ = 0;
    __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  peVar5 = std::__shared_ptr_access<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  iVar2 = (*peVar5->_vptr_IOStream[6])();
  peVar5 = std::__shared_ptr_access<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  iVar3 = (*peVar5->_vptr_IOStream[5])();
  local_50 = CONCAT44(extraout_var,iVar2) - CONCAT44(extraout_var_00,iVar3);
  if (local_50 == 0) {
    read._6_1_ = 1;
    pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_70,"StreamReader: File is empty or EOF is already reached",
               (allocator *)((long)&read + 7));
    DeadlyImportError::DeadlyImportError(pDVar4,&local_70);
    read._6_1_ = 0;
    __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  piVar6 = (int8_t *)operator_new__(local_50);
  this->buffer = piVar6;
  this->current = piVar6;
  peVar5 = std::__shared_ptr_access<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  iVar2 = (*peVar5->_vptr_IOStream[2])(peVar5,this->current,1,local_50);
  if (CONCAT44(extraout_var_01,iVar2) <= local_50) {
    this->limit = this->buffer + CONCAT44(extraout_var_01,iVar2);
    this->end = this->buffer + CONCAT44(extraout_var_01,iVar2);
    return;
  }
  __assert_fail("read <= s",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/include/assimp/StreamReader.h"
                ,0x13d,
                "void Assimp::StreamReader<true, true>::InternBegin() [SwapEndianess = true, RuntimeSwitch = true]"
               );
}

Assistant:

void InternBegin() {
        if (!stream) {
            // in case someone wonders: StreamReader is frequently invoked with
            // no prior validation whether the input stream is valid. Since
            // no one bothers changing the error message, this message here
            // is passed down to the caller and 'unable to open file'
            // simply describes best what happened.
            throw DeadlyImportError("StreamReader: Unable to open file");
        }

        const size_t s = stream->FileSize() - stream->Tell();
        if (!s) {
            throw DeadlyImportError("StreamReader: File is empty or EOF is already reached");
        }

        current = buffer = new int8_t[s];
        const size_t read = stream->Read(current,1,s);
        // (read < s) can only happen if the stream was opened in text mode, in which case FileSize() is not reliable
        ai_assert(read <= s);
        end = limit = &buffer[read-1] + 1;
    }